

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::Msg(Map *this,Character *from,string *message,bool echo)

{
  World *pWVar1;
  Character *other;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  mapped_type *this_00;
  long *plVar6;
  size_type *psVar7;
  _List_node_base *p_Var8;
  list<Character_*,_std::allocator<Character_*>_> *plVar9;
  PacketBuilder builder;
  string local_168;
  string local_148;
  Map *local_128;
  string local_120;
  string local_100;
  string local_e0;
  key_type local_c0;
  undefined1 local_a0 [48];
  string local_70;
  string local_50;
  
  pWVar1 = this->world;
  local_128 = this;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"ChatMaxWidth","");
  this_00 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar1->config,&local_c0);
  iVar4 = util::variant::GetInt(this_00);
  (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_70,from);
  util::ucfirst(&local_50,&local_70);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  psVar7 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120.field_2._8_8_ = plVar6[3];
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar7;
    local_120._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_120._M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  iVar5 = util::text_width(&local_120);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"...","");
  util::text_cap((string *)local_a0,message,iVar4 - iVar5,&local_e0);
  std::__cxx11::string::operator=((string *)message,(string *)local_a0);
  if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
    operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  PacketBuilder::PacketBuilder
            ((PacketBuilder *)local_a0,PACKET_TALK,PACKET_PLAYER,message->_M_string_length + 2);
  iVar4 = Character::PlayerID(from);
  PacketBuilder::AddShort((PacketBuilder *)local_a0,iVar4);
  PacketBuilder::AddString((PacketBuilder *)local_a0,message);
  p_Var8 = (local_128->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  plVar9 = &local_128->characters;
  if (p_Var8 != (_List_node_base *)plVar9) {
    do {
      other = (Character *)p_Var8[1]._M_next;
      bVar3 = Character::InRange(from,other);
      if (bVar3) {
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
        (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_100,from);
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        pcVar2 = (message->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar2,pcVar2 + message->_M_string_length);
        Character::AddChatLog(other,&local_168,&local_100,&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if (other != from || echo) {
          Character::Send(other,(PacketBuilder *)local_a0);
        }
      }
      p_Var8 = p_Var8->_M_next;
    } while (p_Var8 != (_List_node_base *)plVar9);
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_a0);
  return;
}

Assistant:

void Map::Msg(Character *from, std::string message, bool echo)
{
	message = util::text_cap(message, static_cast<int>(this->world->config["ChatMaxWidth"]) - util::text_width(util::ucfirst(from->SourceName()) + "  "));

	PacketBuilder builder(PACKET_TALK, PACKET_PLAYER, 2 + message.length());
	builder.AddShort(from->PlayerID());
	builder.AddString(message);

	UTIL_FOREACH(this->characters, character)
	{
		if (!from->InRange(character))
			continue;

		character->AddChatLog("", from->SourceName(), message);

		if (!echo && character == from)
			continue;

		character->Send(builder);
	}
}